

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

bool __thiscall DialogPrompt::update(DialogPrompt *this,int mouseX,int mouseY,bool clicked)

{
  bool bVar1;
  Vector2f *pVVar2;
  reference pCVar3;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  __normal_iterator<TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_> *in_RDI;
  CheckBox *c;
  iterator __end2_2;
  iterator __begin2_2;
  vector<CheckBox,_std::allocator<CheckBox>_> *__range2_2;
  TextField *f;
  iterator __end2_1;
  iterator __begin2_1;
  vector<TextField,_std::allocator<TextField>_> *__range2_1;
  TextButton *b;
  iterator __end2;
  iterator __begin2;
  vector<TextButton,_std::allocator<TextButton>_> *__range2;
  vector<CheckBox,_std::allocator<CheckBox>_> *in_stack_ffffffffffffff78;
  __normal_iterator<CheckBox_*,_std::vector<CheckBox,_std::allocator<CheckBox>_>_> local_68;
  __normal_iterator<TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_> *local_60;
  reference local_58;
  TextField *local_50;
  __normal_iterator<TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_> local_48;
  __normal_iterator<TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_> *local_40;
  reference local_38;
  TextButton *local_30;
  __normal_iterator<TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_> local_28;
  __normal_iterator<TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_> *local_20;
  byte local_11;
  uint local_10;
  uint local_c;
  
  local_11 = in_CL & 1;
  if (((ulong)in_RDI[0x16]._M_current & 0x100) != 0) {
    local_10 = in_EDX;
    local_c = in_ESI;
    pVVar2 = sf::Transformable::getPosition((Transformable *)(in_RDI + 1));
    local_c = local_c - (int)pVVar2->x;
    pVVar2 = sf::Transformable::getPosition((Transformable *)(in_RDI + 1));
    local_10 = local_10 - (int)pVVar2->y;
    local_20 = in_RDI + 0x70;
    local_28._M_current =
         (TextButton *)
         std::vector<TextButton,_std::allocator<TextButton>_>::begin
                   ((vector<TextButton,_std::allocator<TextButton>_> *)in_stack_ffffffffffffff78);
    local_30 = (TextButton *)
               std::vector<TextButton,_std::allocator<TextButton>_>::end
                         ((vector<TextButton,_std::allocator<TextButton>_> *)
                          in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
                               *)in_RDI,
                              (__normal_iterator<TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
                 ::operator*(&local_28);
      (*(local_38->super_UIComponent).super_Drawable._vptr_Drawable[3])
                (local_38,(ulong)local_c,(ulong)local_10,(ulong)(local_11 & 1));
      __gnu_cxx::
      __normal_iterator<TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>::
      operator++(&local_28);
    }
    local_40 = in_RDI + 0x73;
    local_48._M_current =
         (TextField *)
         std::vector<TextField,_std::allocator<TextField>_>::begin
                   ((vector<TextField,_std::allocator<TextField>_> *)in_stack_ffffffffffffff78);
    local_50 = (TextField *)
               std::vector<TextField,_std::allocator<TextField>_>::end
                         ((vector<TextField,_std::allocator<TextField>_> *)in_stack_ffffffffffffff78
                         );
    while (bVar1 = __gnu_cxx::operator!=
                             (in_RDI,(__normal_iterator<TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_>
                                      *)in_stack_ffffffffffffff78), bVar1) {
      local_58 = __gnu_cxx::
                 __normal_iterator<TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_>
                 ::operator*(&local_48);
      (*(local_58->super_UIComponent).super_Drawable._vptr_Drawable[3])
                (local_58,(ulong)local_c,(ulong)local_10,(ulong)(local_11 & 1));
      __gnu_cxx::__normal_iterator<TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_>
      ::operator++(&local_48);
    }
    local_60 = in_RDI + 0x76;
    local_68._M_current =
         (CheckBox *)
         std::vector<CheckBox,_std::allocator<CheckBox>_>::begin(in_stack_ffffffffffffff78);
    std::vector<CheckBox,_std::allocator<CheckBox>_>::end(in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<CheckBox_*,_std::vector<CheckBox,_std::allocator<CheckBox>_>_>
                               *)in_RDI,
                              (__normal_iterator<CheckBox_*,_std::vector<CheckBox,_std::allocator<CheckBox>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      pCVar3 = __gnu_cxx::
               __normal_iterator<CheckBox_*,_std::vector<CheckBox,_std::allocator<CheckBox>_>_>::
               operator*(&local_68);
      (*(pCVar3->super_UIComponent).super_Drawable._vptr_Drawable[3])
                (pCVar3,(ulong)local_c,(ulong)local_10,(ulong)(local_11 & 1));
      __gnu_cxx::__normal_iterator<CheckBox_*,_std::vector<CheckBox,_std::allocator<CheckBox>_>_>::
      operator++(&local_68);
    }
  }
  return false;
}

Assistant:

bool DialogPrompt::update(int mouseX, int mouseY, bool clicked) {
    if (visible) {
        mouseX -= static_cast<int>(getPosition().x);
        mouseY -= static_cast<int>(getPosition().y);
        for (TextButton& b : optionButtons) {
            b.update(mouseX, mouseY, clicked);
        }
        for (TextField& f : optionFields) {
            f.update(mouseX, mouseY, clicked);
        }
        for (CheckBox& c : optionChecks) {
            c.update(mouseX, mouseY, clicked);
        }
    }
    return false;
}